

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O1

bool_t bsumHidIsValid(size_t hid)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((hid != 0) && (0x200 < hid || (hid & 0x1f) != 0)) {
    uVar1 = 0;
    if ((~((hid / 10) * 10) + hid < 2) && ((0x9ff < hid && ((hid / 10 & 0x7f) == 0)))) {
      uVar1 = (uint)(hid < 0x1900);
    }
  }
  return uVar1;
}

Assistant:

static bool_t bsumHidIsValid(size_t hid)
{
	return hid == 0 ||
		(hid <= 512 && hid % 32 == 0) ||
		(hid % 10 != 0 && hid % 10 <= 2 &&
			(hid / 10) % 128 == 0 && 2 <= hid / 1280 && hid / 1280 <= 4);
}